

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hpp
# Opt level: O2

void __thiscall boost::filesystem::path::path<char_const*>(path *this,char *begin,char *end)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> seq;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  (this->m_pathname)._M_dataplus._M_p = (pointer)&(this->m_pathname).field_2;
  (this->m_pathname)._M_string_length = 0;
  (this->m_pathname).field_2._M_local_buf[0] = '\0';
  if (begin != end) {
    local_30 = local_20;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30);
    path_traits::convert(local_30,local_30 + local_28,&this->m_pathname);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

typename boost::enable_if<path_traits::is_pathable<
        typename boost::decay<Source>::type>, path&>::type
    operator=(Source const& source)
    {
      m_pathname.clear();
      path_traits::dispatch(source, m_pathname);
      return *this;
    }